

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.cpp
# Opt level: O0

void __thiscall hash_table::resize(hash_table *this,size_t sizeMb)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  pointer phVar4;
  ulong uVar5;
  hash_cluster *__p;
  hash_cluster *local_58;
  unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_> local_20;
  size_t local_18;
  size_t sizeMb_local;
  hash_table *this_local;
  
  this->sz_mb = sizeMb;
  this->cluster_count = (this->sz_mb << 0x14) >> 6;
  local_18 = sizeMb;
  sizeMb_local = (size_t)this;
  sVar3 = pow2(this->cluster_count);
  this->cluster_count = sVar3;
  if (this->cluster_count < 0x400) {
    this->cluster_count = 0x400;
  }
  phVar4 = std::unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_>::get
                     (&this->entries);
  if (phVar4 != (pointer)0x0) {
    std::unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_>::reset
              (&this->entries,(nullptr_t)0x0);
  }
  uVar1 = this->cluster_count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar5 = SUB168(auVar2 * ZEXT816(0x40),0);
  if (SUB168(auVar2 * ZEXT816(0x40),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __p = (hash_cluster *)operator_new__(uVar5);
  if (uVar1 != 0) {
    local_58 = __p;
    do {
      local_58->cluster_entries[3].pkey = 0;
      local_58->cluster_entries[3].dkey = 0;
      local_58->cluster_entries[2].pkey = 0;
      local_58->cluster_entries[2].dkey = 0;
      local_58->cluster_entries[1].pkey = 0;
      local_58->cluster_entries[1].dkey = 0;
      local_58->cluster_entries[0].pkey = 0;
      local_58->cluster_entries[0].dkey = 0;
      hash_cluster::hash_cluster(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != __p + uVar1);
  }
  std::unique_ptr<hash_cluster[],std::default_delete<hash_cluster[]>>::
  unique_ptr<hash_cluster*,std::default_delete<hash_cluster[]>,void,bool>
            ((unique_ptr<hash_cluster[],std::default_delete<hash_cluster[]>> *)&local_20,__p);
  std::unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_>::operator=
            (&this->entries,&local_20);
  std::unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_>::~unique_ptr(&local_20);
  clear(this);
  return;
}

Assistant:

void hash_table::resize(size_t sizeMb) {
	sz_mb = sizeMb;
	cluster_count = 1024 * 1024 * sz_mb / sizeof(hash_cluster);
	cluster_count = pow2(cluster_count);
	if (cluster_count < 1024) 
		cluster_count = 1024;
	if (entries.get() != nullptr)
		entries.reset();

	entries = std::unique_ptr<hash_cluster[]>(new hash_cluster[cluster_count]());
	clear();
}